

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

void __thiscall
util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::dynamic_array
          (dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *this,
          dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *other)

{
  size_type sVar1;
  pointer puVar2;
  allocator<unsigned_int> local_19;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *pdStack_18;
  allocator_type my_alloc;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *other_local;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *this_local;
  
  this->_vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_00372010;
  pdStack_18 = other;
  sVar1 = size(other);
  this->elem_count = sVar1;
  this->elems = (pointer)0x0;
  std::allocator<unsigned_int>::allocator(&local_19);
  if (this->elem_count != 0) {
    puVar2 = std::allocator_traits<std::allocator<unsigned_int>_>::allocate
                       (&local_19,(ulong)this->elem_count);
    this->elems = puVar2;
  }
  math::wide_integer::detail::copy_unsafe<unsigned_int*,unsigned_int*>
            (pdStack_18->elems,pdStack_18->elems + this->elem_count,this->elems);
  return;
}

Assistant:

constexpr dynamic_array(const dynamic_array& other)
      : elem_count(other.size())
    {
      allocator_type my_alloc;

      if(elem_count > static_cast<size_type>(UINT8_C(0)))
      {
        elems = std::allocator_traits<allocator_type>::allocate(my_alloc, elem_count);
      }

      #if defined(WIDE_INTEGER_NAMESPACE)
      WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::copy_unsafe(other.elems, other.elems + elem_count, elems);
      #else
      ::math::wide_integer::detail::copy_unsafe(other.elems, other.elems + elem_count, elems);
      #endif
    }